

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

void __thiscall helics::InterfaceInfo::reset(InterfaceInfo *this)

{
  unique_lock<std::shared_mutex> local_30;
  
  local_30._M_device = &(this->publications).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear(&(this->publications).m_obj);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  local_30._M_device = &(this->inputs).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  gmlc::containers::
  DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear(&(this->inputs).m_obj);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  local_30._M_device = &(this->endpoints).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  gmlc::containers::
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear(&(this->endpoints).m_obj);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  this->only_update_on_change = false;
  return;
}

Assistant:

void InterfaceInfo::reset()
{
    publications.lock()->clear();
    inputs.lock()->clear();
    endpoints.lock()->clear();
    only_update_on_change = false;
}